

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O1

int4 PrintLanguage::getCodepoint(uint1 *buf,int4 charsize,bool bigend,int4 *skip)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int4 iVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (charsize != 1) {
    if (charsize == 4) {
      if (bigend) {
        uVar6 = (uint)buf[2] << 8 | (uint)buf[1] << 0x10 | (uint)*buf << 0x18;
        buf = buf + 3;
      }
      else {
        uVar6 = (uint)buf[1] << 8 | (uint)buf[2] << 0x10 | (uint)buf[3] << 0x18;
      }
      uVar6 = *buf | uVar6;
      iVar5 = 4;
    }
    else {
      if (charsize != 2) {
        return -1;
      }
      bVar3 = buf[!bigend] & 0xfc;
      if (bVar3 == 0xdc) {
        return -1;
      }
      uVar7 = (ulong)bigend;
      uVar6 = (uint)CONCAT11(buf[!bigend],buf[uVar7]);
      iVar5 = 2;
      if (bVar3 == 0xd8) {
        uVar6 = (uint)CONCAT11(buf[uVar7 ^ 3],buf[uVar7 + 2]) + uVar6 * 0x400 + 0xfca02400;
        iVar5 = 4;
        if ((buf[uVar7 ^ 3] & 0xfc) != 0xdc) {
          return -1;
        }
      }
    }
    goto LAB_002ff298;
  }
  uVar6 = (uint)*buf;
  iVar5 = 1;
  if ((char)*buf < '\0') {
    if ((uVar6 & 0xffffffe0) == 0xc0) {
      uVar6 = buf[1] & 0x3f | (uVar6 & 0x1f) << 6;
      iVar5 = 2;
      if ((buf[1] & 0xffffffc0) == 0x80) goto LAB_002ff26b;
    }
    else {
      if ((uVar6 & 0xfffffff0) != 0xe0) {
        if ((uVar6 & 0xfffffff8) == 0xf0) {
          bVar1 = (buf[3] & 0xffffffc0) == 0x80;
          bVar2 = (buf[2] & 0xffffffc0) == 0x80;
          bVar4 = (buf[1] & 0xc0) == 0x80;
          bVar8 = bVar1 && (bVar2 && bVar4);
          if (bVar1 && (bVar2 && bVar4)) {
            uVar6 = buf[3] & 0x3f |
                    (buf[2] & 0x3f) << 6 | (buf[1] & 0x3f) << 0xc | (uVar6 & 7) << 0x12;
          }
          iVar5 = 4;
          goto LAB_002ff3b0;
        }
        bVar8 = false;
        iVar5 = 0;
        goto LAB_002ff26e;
      }
      bVar1 = (buf[2] & 0xffffffc0) == 0x80;
      bVar2 = (buf[1] & 0xc0) == 0x80;
      bVar8 = bVar1 && bVar2;
      if (bVar1 && bVar2) {
        uVar6 = buf[2] & 0x3f | (buf[1] & 0x3f) << 6 | (uVar6 & 0xf) << 0xc;
      }
      iVar5 = 3;
LAB_002ff3b0:
      if (bVar8) goto LAB_002ff26b;
    }
    bVar8 = false;
  }
  else {
LAB_002ff26b:
    bVar8 = true;
  }
LAB_002ff26e:
  if (!bVar8) {
    return -1;
  }
LAB_002ff298:
  if ((uVar6 & 0xfffff800) == 0xd800) {
    return -1;
  }
  *skip = iVar5;
  return uVar6;
}

Assistant:

int4 PrintLanguage::getCodepoint(const uint1 *buf,int4 charsize,bool bigend,int4 &skip)

{
  int4 codepoint;
  int4 sk = 0;
  if (charsize==2) {		// UTF-16
    codepoint = readUtf16(buf,bigend);
    sk += 2;
    if ((codepoint>=0xD800)&&(codepoint<=0xDBFF)) { // high surrogate
      int4 trail=readUtf16(buf+2,bigend);
      sk += 2;
      if ((trail<0xDC00)||(trail>0xDFFF)) return -1; // Bad trail
      codepoint = (codepoint<<10) + trail + (0x10000 - (0xD800 << 10) - 0xDC00);
    }
    else if ((codepoint>=0xDC00)&&(codepoint<=0xDFFF)) return -1; // trail before high
  }
  else if (charsize==1) {	// UTF-8
    int4 val = buf[0];
    if ((val&0x80)==0) {
      codepoint = val;
      sk = 1;
    }
    else if ((val&0xe0)==0xc0) {
      int4 val2 = buf[1];
      sk = 2;
      if ((val2&0xc0)!=0x80) return -1; // Not a valid UTF8-encoding
      codepoint = ((val&0x1f)<<6) | (val2 & 0x3f);
    }
    else if ((val&0xf0)==0xe0) {
      int4 val2 = buf[1];
      int4 val3 = buf[2];
      sk = 3;
      if (((val2&0xc0)!=0x80)||((val3&0xc0)!=0x80)) return -1; // invalid encoding
      codepoint = ((val&0xf)<<12) | ((val2&0x3f)<<6) | (val3 & 0x3f);
    }
    else if ((val&0xf8)==0xf0) {
      int4 val2 = buf[1];
      int4 val3 = buf[2];
      int4 val4 = buf[3];
      sk = 4;
      if (((val2&0xc0)!=0x80)||((val3&0xc0)!=0x80)||((val4&0xc0)!=0x80)) return -1;	// invalid encoding
      codepoint = ((val&7)<<18) | ((val2&0x3f)<<12) | ((val3&0x3f)<<6) | (val4 & 0x3f);
    }
    else
      return -1;
  }
  else if (charsize == 4) {	// UTF-32
    sk = 4;
    if (bigend)
      codepoint = (buf[0]<<24) + (buf[1]<<16) + (buf[2]<<8) + buf[3];
    else
      codepoint = (buf[3]<<24) + (buf[2]<<16) + (buf[1]<<8) + buf[0];
  }
  else
    return -1;
  if (codepoint >= 0xd800 && codepoint <= 0xdfff)
    return -1;		// Reserved for surrogates, invalid codepoints
  skip = sk;
  return codepoint;
}